

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

void __thiscall CLayerGroup::Render(CLayerGroup *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  IGraphics *this_00;
  CLayer **ppCVar10;
  long *in_RDI;
  long in_FS_OFFSET;
  float fVar11;
  float fVar12;
  int i;
  float y1;
  float x1;
  float y0;
  float x0;
  IGraphics *pGraphics;
  float aPoints [4];
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int local_3c;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MapScreen((CLayerGroup *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  this_00 = CEditor::Graphics(*(CEditor **)*in_RDI);
  if ((int)in_RDI[5] != 0) {
    Mapping((CLayerGroup *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
            (float *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    fVar11 = ((float)*(int *)((long)in_RDI + 0x2c) - local_18) / (local_10 - local_18);
    fVar12 = ((float)(int)in_RDI[6] - local_14) / (local_c - local_14);
    iVar8 = *(int *)((long)in_RDI + 0x2c);
    iVar9 = *(int *)((long)in_RDI + 0x34);
    lVar2 = in_RDI[6];
    lVar3 = in_RDI[7];
    iVar4 = IGraphics::ScreenWidth(this_00);
    uVar5 = (uint)(fVar11 * (float)iVar4);
    iVar4 = IGraphics::ScreenHeight(this_00);
    uVar6 = (uint)(fVar12 * (float)iVar4);
    iVar4 = IGraphics::ScreenWidth(this_00);
    uVar7 = (uint)((((float)(iVar8 + iVar9) - local_18) / (local_10 - local_18) - fVar11) *
                  (float)iVar4);
    iVar8 = IGraphics::ScreenHeight(this_00);
    (*(this_00->super_IInterface)._vptr_IInterface[3])
              (this_00,(ulong)uVar5,(ulong)uVar6,(ulong)uVar7,
               (ulong)(uint)(int)((((float)((int)lVar2 + (int)lVar3) - local_14) /
                                   (local_c - local_14) - fVar12) * (float)iVar8));
  }
  local_3c = 0;
  while (iVar8 = local_3c,
        iVar9 = array<CLayer_*,_allocator_default<CLayer_*>_>::size
                          ((array<CLayer_*,_allocator_default<CLayer_*>_> *)(in_RDI + 1)),
        iVar8 < iVar9) {
    ppCVar10 = array<CLayer_*,_allocator_default<CLayer_*>_>::operator[]
                         ((array<CLayer_*,_allocator_default<CLayer_*>_> *)(in_RDI + 1),local_3c);
    if (((((*ppCVar10)->m_Visible & 1U) != 0) &&
        (ppCVar10 = array<CLayer_*,_allocator_default<CLayer_*>_>::operator[]
                              ((array<CLayer_*,_allocator_default<CLayer_*>_> *)(in_RDI + 1),
                               local_3c), *ppCVar10 != *(CLayer **)(*in_RDI + 0x1e0))) &&
       (((*(byte *)(*(long *)*in_RDI + 0x10b1) & 1) != 0 ||
        (ppCVar10 = array<CLayer_*,_allocator_default<CLayer_*>_>::operator[]
                              ((array<CLayer_*,_allocator_default<CLayer_*>_> *)(in_RDI + 1),
                               local_3c), ((*ppCVar10)->m_Flags & 1U) == 0)))) {
      ppCVar10 = array<CLayer_*,_allocator_default<CLayer_*>_>::operator[]
                           ((array<CLayer_*,_allocator_default<CLayer_*>_> *)(in_RDI + 1),local_3c);
      (*(*ppCVar10)->_vptr_CLayer[10])();
    }
    local_3c = local_3c + 1;
  }
  if ((int)in_RDI[5] != 0) {
    (*(this_00->super_IInterface)._vptr_IInterface[4])();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CLayerGroup::Render()
{
	MapScreen();
	IGraphics *pGraphics = m_pMap->m_pEditor->Graphics();

	if(m_UseClipping)
	{
		float aPoints[4];
		m_pMap->m_pGameGroup->Mapping(aPoints);
		float x0 = (m_ClipX - aPoints[0]) / (aPoints[2]-aPoints[0]);
		float y0 = (m_ClipY - aPoints[1]) / (aPoints[3]-aPoints[1]);
		float x1 = ((m_ClipX+m_ClipW) - aPoints[0]) / (aPoints[2]-aPoints[0]);
		float y1 = ((m_ClipY+m_ClipH) - aPoints[1]) / (aPoints[3]-aPoints[1]);

		pGraphics->ClipEnable((int)(x0*pGraphics->ScreenWidth()), (int)(y0*pGraphics->ScreenHeight()),
			(int)((x1-x0)*pGraphics->ScreenWidth()), (int)((y1-y0)*pGraphics->ScreenHeight()));
	}

	for(int i = 0; i < m_lLayers.size(); i++)
	{
		if(m_lLayers[i]->m_Visible && m_lLayers[i] != m_pMap->m_pGameLayer)
		{
			if(m_pMap->m_pEditor->m_ShowDetail || !(m_lLayers[i]->m_Flags&LAYERFLAG_DETAIL))
				m_lLayers[i]->Render();
		}
	}

	if(m_UseClipping)
		pGraphics->ClipDisable();
}